

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O1

void duckdb::
     PrintfFunction<duckdb::FMTFormat,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ValidityMask *this;
  VectorType VVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unsigned_long *puVar2;
  ValidityMask *pVVar3;
  Vector *vector;
  FMTFormat *pFVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  TemplatedValidityData<unsigned_long> *pTVar6;
  reference pvVar7;
  long lVar8;
  InternalException *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  data_ptr_t pdVar10;
  data_ptr_t pdVar11;
  size_type sVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  string_t sVar14;
  string dynamic_result;
  vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
  format_args;
  string format_string;
  vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_true>
  string_args;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b8;
  iterator iStack_b0;
  basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
  *local_a8;
  Vector *local_98;
  reference local_90;
  FMTFormat *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  FMTFormat local_78 [16];
  ValidityMask *local_68;
  data_ptr_t local_60;
  data_ptr_t local_58;
  data_ptr_t local_50;
  vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  local_90 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  FlatVector::VerifyFlatVector(result);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  local_d8.long_long_value = args->count;
  (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = local_d8.long_long_value;
  make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
            ((duckdb *)&local_88,(unsigned_long *)&local_d8.uint_value);
  p_Var5 = p_Stack_80;
  pFVar4 = local_88;
  local_88 = (FMTFormat *)0x0;
  p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pFVar4;
  (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  local_98 = result;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  this = &local_98->validity;
  pVVar3 = &local_98->validity;
  if (p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
  }
  pTVar6 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                     (&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_data);
  (this->super_TemplatedValidityMask<unsigned_long>).validity_mask =
       (unsigned_long *)
       (pTVar6->owned_data).super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>
       ._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
       super__Head_base<0UL,_unsigned_long_*,_false>;
  if ((args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar12 = 0;
    do {
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar12);
      VVar1 = pvVar7->vector_type;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar12);
      vector = local_98;
      if (VVar1 == CONSTANT_VECTOR) {
        puVar2 = (pvVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar2 != (unsigned_long *)0x0) && ((*puVar2 & 1) == 0)) {
          Vector::SetVectorType(local_98,CONSTANT_VECTOR);
          ConstantVector::SetNull(vector,true);
          return;
        }
      }
      else {
        Vector::Flatten(pvVar7,args->count);
        Vector::SetVectorType(local_98,FLAT_VECTOR);
        pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar12);
        FlatVector::VerifyFlatVector(pvVar7);
        ValidityMask::Combine(this,&pvVar7->validity,args->count);
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 < (ulong)(((long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(args->data).
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  pdVar10 = &DAT_00000001;
  if (local_98->vector_type != CONSTANT_VECTOR) {
    pdVar10 = (data_ptr_t)args->count;
  }
  if (pdVar10 != (data_ptr_t)0x0) {
    pdVar11 = local_90->data;
    local_60 = local_98->data;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    local_68 = this;
    local_58 = pdVar11;
    local_50 = pdVar10;
    do {
      if (((local_98->vector_type != FLAT_VECTOR) ||
          (puVar2 = (local_68->super_TemplatedValidityMask<unsigned_long>).validity_mask,
          puVar2 == (unsigned_long *)0x0)) ||
         (in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((ulong)paVar13 >> 6),
         (puVar2[(long)in_RCX] >> ((ulong)paVar13 & 0x3f) & 1) != 0)) {
        paVar9 = paVar13;
        if (local_90->vector_type == CONSTANT_VECTOR) {
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        }
        lVar8 = (long)paVar9 * 0x10;
        if ((ulong)*(uint *)(pdVar11 + lVar8) < 0xd) {
          pdVar10 = pdVar11 + lVar8 + 4;
        }
        else {
          pdVar10 = *(data_ptr_t *)(pdVar11 + lVar8 + 8);
        }
        local_88 = local_78;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,pdVar10,pdVar10 + *(uint *)(pdVar11 + lVar8));
        local_a8 = (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                    *)0x0;
        local_b8 = (pointer)0x0;
        iStack_b0._M_current =
             (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
              *)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (1 < (ulong)(((long)(args->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(args->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5))
        {
          sVar12 = 1;
          do {
            pvVar7 = vector<duckdb::Vector,_true>::operator[](&args->data,sVar12);
            in_RCX = paVar13;
            if (pvVar7->vector_type == CONSTANT_VECTOR) {
              in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
            }
            switch((pvVar7->type).id_) {
            case BOOLEAN:
              local_c8._M_allocated_capacity._0_4_ = 8;
              local_d8.ulong_long_value =
                   CONCAT71((int7)((ulong)local_d8._0_8_ >> 8),pvVar7->data[(long)in_RCX]) &
                   0xffffffff000000ff;
              if (iStack_b0._M_current == local_a8) {
                ::std::
                vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                ::
                _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                          ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                            *)&local_b8,iStack_b0,
                           (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                            *)&local_d8.string);
              }
              else {
LAB_0104d14e:
                *(ulong *)&(iStack_b0._M_current)->type_ =
                     CONCAT44(local_c8._M_allocated_capacity._4_4_,
                              local_c8._M_allocated_capacity._0_4_);
                *(undefined8 *)&(iStack_b0._M_current)->field_0x18 = local_c8._8_8_;
                ((iStack_b0._M_current)->value_).field_0.long_long_value = local_d8.long_long_value;
                ((iStack_b0._M_current)->value_).field_0.string.size = local_d8.string.size;
                iStack_b0._M_current = iStack_b0._M_current + 1;
              }
              break;
            case TINYINT:
              local_c8._M_allocated_capacity._0_4_ = 2;
              local_d8.int_value = (int)(char)pvVar7->data[(long)in_RCX];
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            case SMALLINT:
              local_c8._M_allocated_capacity._0_4_ = 2;
              local_d8.int_value = (int)*(short *)(pvVar7->data + (long)in_RCX * 2);
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            case INTEGER:
              local_c8._M_allocated_capacity._0_4_ = 2;
              local_d8.int_value = *(undefined4 *)(pvVar7->data + (long)in_RCX * 4);
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            case BIGINT:
              local_c8._M_allocated_capacity._0_4_ = 4;
              local_d8.long_long_value = *(undefined8 *)(pvVar7->data + (long)in_RCX * 8);
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            default:
              this_01 = (InternalException *)__cxa_allocate_exception(0x10);
              local_d8.pointer = &local_c8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d8,"Unexpected type for printf format","");
              InternalException::InternalException(this_01,(string *)&local_d8.string);
              __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            case FLOAT:
              local_c8._M_allocated_capacity._0_4_ = 10;
              local_d8.int_value = *(undefined4 *)(pvVar7->data + (long)in_RCX * 4);
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            case DOUBLE:
              local_c8._M_allocated_capacity._0_4_ = 0xb;
              local_d8.long_long_value = *(undefined8 *)(pvVar7->data + (long)in_RCX * 8);
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            case VARCHAR:
              pdVar10 = pvVar7->data;
              lVar8 = (long)in_RCX * 0x10;
              local_d8.string.size = (size_t)*(uint *)(pdVar10 + lVar8);
              if (local_d8.string.size < 0xd) {
                in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(pdVar10 + lVar8 + 4);
              }
              else {
                in_RCX = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           **)(pdVar10 + lVar8 + 8);
              }
              local_c8._M_allocated_capacity._0_4_ = 0xe;
              local_d8.named_arg = (named_arg_base<char> *)in_RCX;
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
              break;
            case UBIGINT:
              local_c8._M_allocated_capacity._0_4_ = 5;
              local_d8.long_long_value = *(undefined8 *)(pvVar7->data + (long)in_RCX * 8);
              if (iStack_b0._M_current != local_a8) goto LAB_0104d14e;
              ::std::
              vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
              ::
              _M_realloc_insert<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>
                        ((vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>,std::allocator<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>>
                          *)&local_b8,iStack_b0,
                         (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                          *)&local_d8.string);
            }
            sVar12 = sVar12 + 1;
          } while (sVar12 < (ulong)(((long)(args->data).
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(args->data).
                                           super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           .
                                           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   0x4ec4ec4ec4ec4ec5));
        }
        FMTFormat::
        OP<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                  ((string *)&local_d8.string,local_88,(char *)&local_b8,
                   (vector<duckdb_fmt::v6::basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>,_true>
                    *)in_RCX);
        sVar14 = StringVector::AddString(local_98,(string *)&local_d8.string);
        in_RCX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar13 * 0x10);
        *(long *)(local_60 + (long)in_RCX) = sVar14.value._0_8_;
        *(long *)(local_60 + 8 + (long)in_RCX) = sVar14.value._8_8_;
        if (local_d8._0_8_ != &local_c8) {
          operator_delete(local_d8.pointer);
        }
        ::std::
        vector<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>,_std::allocator<duckdb::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char>,_false>_>_>
        ::~vector(&local_48);
        if (local_b8 != (pointer)0x0) {
          operator_delete(local_b8);
        }
        pdVar10 = local_50;
        pdVar11 = local_58;
        if (local_88 != local_78) {
          operator_delete(local_88);
          pdVar10 = local_50;
          pdVar11 = local_58;
        }
      }
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar13 + 1);
    } while (paVar13 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pdVar10);
  }
  return;
}

Assistant:

static void PrintfFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &format_string = args.data[0];
	auto &result_validity = FlatVector::Validity(result);
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	result_validity.Initialize(args.size());
	for (idx_t i = 0; i < args.ColumnCount(); i++) {
		switch (args.data[i].GetVectorType()) {
		case VectorType::CONSTANT_VECTOR:
			if (ConstantVector::IsNull(args.data[i])) {
				// constant null! result is always NULL regardless of other input
				result.SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(result, true);
				return;
			}
			break;
		default:
			// FLAT VECTOR, we can directly OR the nullmask
			args.data[i].Flatten(args.size());
			result.SetVectorType(VectorType::FLAT_VECTOR);
			result_validity.Combine(FlatVector::Validity(args.data[i]), args.size());
			break;
		}
	}
	idx_t count = result.GetVectorType() == VectorType::CONSTANT_VECTOR ? 1 : args.size();

	auto format_data = FlatVector::GetData<string_t>(format_string);
	auto result_data = FlatVector::GetData<string_t>(result);
	for (idx_t idx = 0; idx < count; idx++) {
		if (result.GetVectorType() == VectorType::FLAT_VECTOR && FlatVector::IsNull(result, idx)) {
			// this entry is NULL: skip it
			continue;
		}

		// first fetch the format string
		auto fmt_idx = format_string.GetVectorType() == VectorType::CONSTANT_VECTOR ? 0 : idx;
		auto format_string = format_data[fmt_idx].GetString();

		// now gather all the format arguments
		vector<duckdb_fmt::basic_format_arg<CTX>> format_args;
		vector<unsafe_unique_array<data_t>> string_args;

		for (idx_t col_idx = 1; col_idx < args.ColumnCount(); col_idx++) {
			auto &col = args.data[col_idx];
			idx_t arg_idx = col.GetVectorType() == VectorType::CONSTANT_VECTOR ? 0 : idx;
			switch (col.GetType().id()) {
			case LogicalTypeId::BOOLEAN: {
				auto arg_data = FlatVector::GetData<bool>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::TINYINT: {
				auto arg_data = FlatVector::GetData<int8_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::SMALLINT: {
				auto arg_data = FlatVector::GetData<int16_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::INTEGER: {
				auto arg_data = FlatVector::GetData<int32_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::BIGINT: {
				auto arg_data = FlatVector::GetData<int64_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::UBIGINT: {
				auto arg_data = FlatVector::GetData<uint64_t>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::FLOAT: {
				auto arg_data = FlatVector::GetData<float>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::DOUBLE: {
				auto arg_data = FlatVector::GetData<double>(col);
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(arg_data[arg_idx]));
				break;
			}
			case LogicalTypeId::VARCHAR: {
				auto arg_data = FlatVector::GetData<string_t>(col);
				auto string_view =
				    duckdb_fmt::basic_string_view<char>(arg_data[arg_idx].GetData(), arg_data[arg_idx].GetSize());
				format_args.emplace_back(duckdb_fmt::internal::make_arg<CTX>(string_view));
				break;
			}
			default:
				throw InternalException("Unexpected type for printf format");
			}
		}
		// finally actually perform the format
		string dynamic_result = FORMAT_FUN::template OP<CTX>(format_string.c_str(), format_args);
		result_data[idx] = StringVector::AddString(result, dynamic_result);
	}
}